

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

void MpiNotifyConnFailure(CP_Services Svcs,DP_RS_Stream Stream_v,int FailedPeerRank)

{
  MpiStreamRD Stream;
  
  (*Svcs->verbose)(*Stream_v,5,
                   "received notification that writer peer %d has failed, failing any pending requests\n"
                   ,FailedPeerRank,Svcs->verbose);
  return;
}

Assistant:

static void MpiNotifyConnFailure(CP_Services Svcs, DP_RS_Stream Stream_v, int FailedPeerRank)
{
    /* DP_RS_Stream is the return from InitReader */
    MpiStreamRD Stream = (MpiStreamRD)Stream_v;
    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose,
                  "received notification that writer peer "
                  "%d has failed, failing any pending "
                  "requests\n",
                  FailedPeerRank);
}